

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileBacktrace *bt)

{
  bool bVar1;
  cmListFileBacktrace backtrace;
  ostringstream msg;
  cmListFileBacktrace local_1d0;
  undefined1 local_1a0 [376];
  
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
            (&local_1d0.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>,
             &bt->super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  local_1d0.Snapshot.Position.Position = (bt->Snapshot).Position.Position;
  local_1d0.Snapshot.State = (bt->Snapshot).State;
  local_1d0.Snapshot.Position.Tree = (bt->Snapshot).Position.Tree;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  bVar1 = PrintMessagePreamble(this,t,(ostream *)local_1a0);
  if (bVar1) {
    cmListFileBacktrace::PrintTitle(&local_1d0,(ostream *)local_1a0);
    printMessageText((ostream *)local_1a0,text);
    cmListFileBacktrace::PrintCallStack(&local_1d0,(ostream *)local_1a0);
    displayMessage(t,(ostringstream *)local_1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_1d0.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileBacktrace const& bt)
{
  cmListFileBacktrace backtrace = bt;

  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  backtrace.PrintTitle(msg);

  printMessageText(msg, text);

  // Add the rest of the context.
  backtrace.PrintCallStack(msg);

  displayMessage(t, msg);
}